

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> __thiscall
slang::ast::RandSeqProductionSymbol::getRules(RandSeqProductionSymbol *this)

{
  SyntaxNode *pSVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  undefined4 extraout_var;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> src;
  Symbol *extraout_RDX;
  size_t extraout_RDX_00;
  ulong uVar4;
  ulong uVar5;
  self_type copy;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> ruleBlock;
  StatementBlockSymbol *pSVar6;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  sVar7;
  SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> buffer;
  ASTContext local_308;
  Rule local_2d0;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> local_288 [6];
  
  if ((this->rules).
      super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged == false) {
    pSVar1 = (this->super_Symbol).originatingSyntax;
    local_308.scope.ptr = &this->super_Scope;
    local_308.lookupIndex = 0xffffffff;
    local_308.flags.m_bits = 0;
    local_308.instanceOrProc = (Symbol *)0x0;
    local_308.firstTempVar = (TempVarSymbol *)0x0;
    local_308.randomizeDetails = (RandomizeDetails *)0x0;
    local_308.assertionInstance = (AssertionInstanceDetails *)0x0;
    sVar7 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(local_308.scope.ptr);
    src = sVar7._M_end.current;
    local_288[0].data_ = (pointer)local_288[0].firstElement;
    local_288[0].len = 0;
    local_288[0].cap = 8;
    uVar4 = *(long *)(pSVar1 + 5) + 1;
    if (1 < uVar4) {
      uVar5 = 0;
      ruleBlock.current = sVar7._M_begin.current.current;
      do {
        ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             (pSVar1[4].previewNode + uVar5 * 2));
        for (pSVar6 = (StatementBlockSymbol *)((Symbol *)&(ruleBlock.current)->kind)->nextInScope;
            (pSVar6 != (StatementBlockSymbol *)0x0 &&
            ((pSVar6->super_Symbol).kind != StatementBlock));
            pSVar6 = (StatementBlockSymbol *)(pSVar6->super_Symbol).nextInScope) {
        }
        createRule(&local_2d0,(RsRuleSyntax *)*ppSVar3,&local_308,
                   (StatementBlockSymbol *)ruleBlock.current);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
        emplace_back<slang::ast::RandSeqProductionSymbol::Rule>(local_288,&local_2d0);
        uVar5 = uVar5 + 1;
        src.current = extraout_RDX;
        ruleBlock.current = &pSVar6->super_Symbol;
      } while (uVar5 != uVar4 >> 1);
    }
    iVar2 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
                      (local_288,(EVP_PKEY_CTX *)(local_308.scope.ptr)->compilation,
                       (EVP_PKEY_CTX *)src.current);
    (this->rules).
    super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
    (this->rules).
    super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value._M_extent._M_extent_value = extraout_RDX_00;
    if ((this->rules).
        super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (this->rules).
      super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged = true;
    }
    if (local_288[0].data_ != (pointer)local_288[0].firstElement) {
      operator_delete(local_288[0].data_);
    }
  }
  return (this->rules).
         super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
         ._M_payload._M_value;
}

Assistant:

std::span<const RandSeqProductionSymbol::Rule> RandSeqProductionSymbol::getRules() const {
    if (!rules) {
        auto syntax = getSyntax();
        SLANG_ASSERT(syntax);

        ASTContext context(*this, LookupLocation::max);

        auto blocks = membersOfType<StatementBlockSymbol>();
        auto blockIt = blocks.begin();

        SmallVector<Rule, 8> buffer;
        for (auto rule : syntax->as<ProductionSyntax>().rules) {
            SLANG_ASSERT(blockIt != blocks.end());
            buffer.push_back(createRule(*rule, context, *blockIt++));
        }

        rules = buffer.copy(context.getCompilation());
    }
    return *rules;
}